

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void RulePrint(FILE *fp,rule *rp,int iCursor)

{
  undefined8 *puVar1;
  int in_EDX;
  undefined8 *in_RSI;
  FILE *in_RDI;
  int j;
  int i;
  symbol *sp;
  int local_28;
  int local_24;
  
  fprintf(in_RDI,"%s ::=",*(undefined8 *)*in_RSI);
  local_24 = 0;
  while( true ) {
    if (*(int *)(in_RSI + 3) < local_24) {
      return;
    }
    if (local_24 == in_EDX) {
      fprintf(in_RDI," *");
    }
    if (local_24 == *(int *)(in_RSI + 3)) break;
    puVar1 = *(undefined8 **)(in_RSI[4] + (long)local_24 * 8);
    if (*(int *)((long)puVar1 + 0xc) == 2) {
      fprintf(in_RDI," %s",**(undefined8 **)puVar1[0xc]);
      for (local_28 = 1; local_28 < *(int *)(puVar1 + 0xb); local_28 = local_28 + 1) {
        fprintf(in_RDI,"|%s",**(undefined8 **)(puVar1[0xc] + (long)local_28 * 8));
      }
    }
    else {
      fprintf(in_RDI," %s",*puVar1);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void RulePrint(FILE *fp, struct rule *rp, int iCursor){
  struct symbol *sp;
  int i, j;
  fprintf(fp,"%s ::=",rp->lhs->name);
  for(i=0; i<=rp->nrhs; i++){
    if( i==iCursor ) fprintf(fp," *");
    if( i==rp->nrhs ) break;
    sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(fp," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(fp,"|%s",sp->subsym[j]->name);
      }
    }else{
      fprintf(fp," %s", sp->name);
    }
  }
}